

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O0

V2f Imf_3_4::LatLongMap::pixelPosition(Box2i *dataWindow,V3f *direction)

{
  V2f *in_RSI;
  Box2i *in_RDI;
  V2f VVar1;
  
  latLong((V3f *)in_RDI);
  VVar1 = pixelPosition(in_RDI,in_RSI);
  return VVar1;
}

Assistant:

V2f
pixelPosition (const Box2i& dataWindow, const V3f& direction)
{
    return pixelPosition (dataWindow, latLong (direction));
}